

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t n;
  size_t *psVar2;
  mbedtls_mpi_uint **ppmVar3;
  mbedtls_mpi TB;
  mbedtls_mpi local_40;
  
  iVar1 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar1 < 0) {
    return -10;
  }
  psVar2 = &local_40.n;
  local_40.s = 1;
  local_40.n = 0;
  local_40.p = (mbedtls_mpi_uint *)0x0;
  if (X == B) {
    iVar1 = mbedtls_mpi_copy(&local_40,B);
    if (iVar1 != 0) goto LAB_0014c9a8;
    ppmVar3 = &local_40.p;
  }
  else {
    ppmVar3 = &B->p;
    psVar2 = &B->n;
  }
  if ((X == A) || (iVar1 = mbedtls_mpi_copy(X,A), iVar1 == 0)) {
    X->s = 1;
    iVar1 = 0;
    for (n = *psVar2; n != 0; n = n - 1) {
      if ((*ppmVar3)[n - 1] != 0) goto LAB_0014c981;
    }
    n = 0;
LAB_0014c981:
    mpi_sub_hlp(n,*ppmVar3,X->p);
  }
LAB_0014c9a8:
  mbedtls_mpi_free(&local_40);
  return iVar1;
}

Assistant:

int mbedtls_mpi_sub_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    mbedtls_mpi TB;
    int ret;
    size_t n;

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    mbedtls_mpi_init( &TB );

    if( X == B )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );
        B = &TB;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned subtractions.
     */
    X->s = 1;

    ret = 0;

    for( n = B->n; n > 0; n-- )
        if( B->p[n - 1] != 0 )
            break;

    mpi_sub_hlp( n, B->p, X->p );

cleanup:

    mbedtls_mpi_free( &TB );

    return( ret );
}